

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osd_g.c
# Opt level: O0

int osd_g(mod2sparse *A,char *synd,char *osd0_decoding,char *osdw_decoding,double *log_prob_ratios,
         int osd_order,int A_rank)

{
  int len;
  int len_00;
  int iVar1;
  int iVar2;
  mod2sparse *m;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  char *u;
  char *val;
  char *out_vec;
  double *log_prob_ratios_00;
  char *osd0_decoding_00;
  void *__ptr_02;
  long in_RCX;
  char *in_RDX;
  char *in_RSI;
  int *in_RDI;
  mod2sparse *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int bit_no_2;
  int col_no_2;
  unsigned_long j_1;
  unsigned_long i;
  int bit_no_1;
  int col_no_1;
  unsigned_long j;
  int solution_weight;
  int bit_no;
  int osd_min_weight;
  int osd_0_weight;
  int col_no;
  int *w1_osd_cols;
  int *w1_osd_weights;
  char *Htx;
  char *g;
  char *y;
  char *x;
  int *rows;
  int *cols;
  int *Ht_cols;
  mod2sparse *Ht;
  mod2sparse *U;
  mod2sparse *L;
  int k;
  int N;
  int M;
  undefined8 in_stack_ffffffffffffff10;
  int iVar3;
  undefined4 in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  undefined4 uVar4;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int *in_stack_ffffffffffffff30;
  mod2sparse *rows_00;
  mod2sparse *in_stack_ffffffffffffff38;
  mod2sparse *U_00;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  mod2sparse *in_stack_ffffffffffffff48;
  ulong uVar5;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int iVar6;
  undefined4 in_stack_ffffffffffffff5c;
  int local_9c;
  
  len = *in_RDI;
  len_00 = in_RDI[1];
  iVar1 = len_00 - in_stack_00000008;
  mod2sparse_allocate(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
  mod2sparse_allocate(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
  m = mod2sparse_allocate(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
  __ptr = chk_alloc((uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),(uint)in_stack_ffffffffffffff10
                   );
  __ptr_00 = chk_alloc((uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (uint)in_stack_ffffffffffffff10);
  __ptr_01 = chk_alloc((uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (uint)in_stack_ffffffffffffff10);
  u = (char *)chk_alloc((uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                        (uint)in_stack_ffffffffffffff10);
  val = (char *)chk_alloc((uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                          (uint)in_stack_ffffffffffffff10);
  out_vec = (char *)chk_alloc((uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                              (uint)in_stack_ffffffffffffff10);
  log_prob_ratios_00 =
       (double *)
       chk_alloc((uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),(uint)in_stack_ffffffffffffff10);
  osd0_decoding_00 =
       (char *)chk_alloc((uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                         (uint)in_stack_ffffffffffffff10);
  __ptr_02 = chk_alloc((uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (uint)in_stack_ffffffffffffff10);
  uVar4 = 1;
  iVar3 = in_stack_00000008;
  osd_0_solve((mod2sparse *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
              (mod2sparse *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff48,
              (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              &in_stack_ffffffffffffff38->n_rows,(char *)in_stack_ffffffffffffff30,osd0_decoding_00,
              log_prob_ratios_00,(int)out_vec,(int)val);
  for (local_9c = 0; local_9c < iVar1; local_9c = local_9c + 1) {
    *(undefined4 *)((long)__ptr + (long)local_9c * 4) =
         *(undefined4 *)((long)__ptr_00 + (long)(local_9c + in_stack_00000008) * 4);
  }
  mod2sparse_copycols((mod2sparse *)CONCAT44(in_stack_ffffffffffffff24,uVar4),
                      (mod2sparse *)CONCAT44(in_stack_ffffffffffffff1c,iVar3),&in_R8->n_rows);
  iVar2 = bin_char_weight(in_RDX,len_00);
  for (iVar6 = 0; iVar6 < len_00; iVar6 = iVar6 + 1) {
    *(char *)(in_RCX + iVar6) = in_RDX[iVar6];
  }
  for (uVar5 = 0; uVar5 < (ulong)(long)iVar1; uVar5 = uVar5 + 1) {
    u[uVar5] = '\x01';
    mod2sparse_mulvec(m,u,(char *)log_prob_ratios_00);
    bin_char_add(in_RSI,(char *)log_prob_ratios_00,out_vec,len);
    LU_forward_backward_solve
              ((mod2sparse *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (char *)CONCAT44(in_stack_ffffffffffffff24,uVar4),
               (char *)CONCAT44(in_stack_ffffffffffffff1c,iVar3));
    for (in_stack_ffffffffffffff44 = 0; in_stack_ffffffffffffff44 < iVar1;
        in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 + 1) {
      val[*(int *)((long)__ptr + (long)in_stack_ffffffffffffff44 * 4)] =
           u[in_stack_ffffffffffffff44];
    }
    iVar6 = bin_char_weight(val,len_00);
    if (iVar6 < iVar2) {
      for (in_stack_ffffffffffffff40 = 0; iVar2 = iVar6, in_stack_ffffffffffffff40 < len_00;
          in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + 1) {
        *(char *)(in_RCX + in_stack_ffffffffffffff40) = val[in_stack_ffffffffffffff40];
      }
    }
    *(int *)(osd0_decoding_00 + uVar5 * 4) = iVar6;
    u[uVar5] = '\0';
  }
  col_sort_int((int *)CONCAT44(in_stack_ffffffffffffff24,uVar4),
               (int *)CONCAT44(in_stack_ffffffffffffff1c,iVar3),(int)((ulong)in_R8 >> 0x20));
  for (U_00 = (mod2sparse *)0x0; U_00 < (mod2sparse *)(long)in_R9D;
      U_00 = (mod2sparse *)((long)&U_00->n_rows + 1)) {
    for (rows_00 = (mod2sparse *)0x0; rows_00 < (mod2sparse *)(long)in_R9D;
        rows_00 = (mod2sparse *)((long)&rows_00->n_rows + 1)) {
      if (U_00 < rows_00) {
        u[*(int *)((long)__ptr_02 + (long)U_00 * 4)] = '\x01';
        u[*(int *)((long)__ptr_02 + (long)rows_00 * 4)] = '\x01';
        mod2sparse_mulvec(m,u,(char *)log_prob_ratios_00);
        bin_char_add(in_RSI,(char *)log_prob_ratios_00,out_vec,len);
        LU_forward_backward_solve
                  ((mod2sparse *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),U_00,
                   &rows_00->n_rows,
                   (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   (char *)CONCAT44(in_stack_ffffffffffffff24,uVar4),
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,iVar3));
        for (in_stack_ffffffffffffff2c = 0; in_stack_ffffffffffffff2c < iVar1;
            in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c + 1) {
          val[*(int *)((long)__ptr + (long)in_stack_ffffffffffffff2c * 4)] =
               u[in_stack_ffffffffffffff2c];
        }
        iVar6 = bin_char_weight(val,len_00);
        if (iVar6 < iVar2) {
          for (in_stack_ffffffffffffff28 = 0; iVar2 = iVar6, in_stack_ffffffffffffff28 < len_00;
              in_stack_ffffffffffffff28 = in_stack_ffffffffffffff28 + 1) {
            *(char *)(in_RCX + in_stack_ffffffffffffff28) = val[in_stack_ffffffffffffff28];
          }
        }
        u[*(int *)((long)__ptr_02 + (long)U_00 * 4)] = '\0';
        u[*(int *)((long)__ptr_02 + (long)rows_00 * 4)] = '\0';
      }
    }
  }
  free(osd0_decoding_00);
  free(__ptr_02);
  free(log_prob_ratios_00);
  free(__ptr);
  free(u);
  free(val);
  free(out_vec);
  mod2sparse_free(in_R8);
  free(__ptr_01);
  free(__ptr_00);
  mod2sparse_free(in_R8);
  mod2sparse_free(in_R8);
  return 0;
}

Assistant:

int osd_g(
        mod2sparse *A,
        char *synd,
        char *osd0_decoding,
        char *osdw_decoding,
        double *log_prob_ratios,
        int osd_order,
        int A_rank){

    int M = mod2sparse_rows(A);
    int N = mod2sparse_cols(A);

    int k= N - A_rank;
    mod2sparse *L=mod2sparse_allocate(M, A_rank);
    mod2sparse *U=mod2sparse_allocate(A_rank, N);
    mod2sparse *Ht=mod2sparse_allocate(M,k);
    int *Ht_cols=chk_alloc(k,sizeof(*Ht_cols));
    int *cols=chk_alloc(N,sizeof(*cols));
    int *rows=chk_alloc(M,sizeof(*rows));

    char *x=chk_alloc(N,sizeof(*x));
    char *y=chk_alloc(N,sizeof(*y));
    char *g=chk_alloc(M,sizeof(*g));
    char *Htx=chk_alloc(M,sizeof(*Htx));

    int *w1_osd_weights=chk_alloc(k,sizeof(*w1_osd_weights));
    int *w1_osd_cols=chk_alloc(k,sizeof(*w1_osd_cols));

//    printf("w: %i",osd_order);

//    exit(22);

    osd_0_solve(
            A,
            L,
            U,
            cols,
            rows,
            synd,
            osd0_decoding,
            log_prob_ratios,
            A_rank,
            1);

    //create the H_T matrix
    for(int col_no=0;col_no<k;col_no++){
        Ht_cols[col_no]=cols[col_no + A_rank];
    }
    mod2sparse_copycols(A,Ht,Ht_cols);


    /*Calculate the weight of the OSD_0 solution. Higher order solutions are compared against this*/
    int osd_0_weight=bin_char_weight(osd0_decoding,N);

    /*Set OSD_0 as the benchmark to beat*/
    int osd_min_weight=osd_0_weight;
    for(int bit_no=0;bit_no<N;bit_no++) osdw_decoding[bit_no]=osd0_decoding[bit_no]; //osdw_decoding is set to osd0_decoding initially

    /*Search through the encoding strings*/
    int solution_weight;
    for(long unsigned int j=0; j<k;j++){

        x[j]=1;
        mod2sparse_mulvec(Ht,x,Htx);
        bin_char_add(synd,Htx,g,M);
        LU_forward_backward_solve(L, U, rows, cols, g, y);

        for(int col_no=0;col_no<k;col_no++){
                y[Ht_cols[col_no]]=x[col_no];
            }

        solution_weight=bin_char_weight(y,N);

        if(solution_weight<osd_min_weight){
            osd_min_weight=solution_weight;
            for(int bit_no=0;bit_no<N;bit_no++) osdw_decoding[bit_no]=y[bit_no];
        }

        w1_osd_weights[j]=solution_weight;
        x[j]=0;

    }



    col_sort_int(w1_osd_weights,w1_osd_cols,k);

    for(long unsigned int i =0; i<osd_order;i++){
        for(long unsigned int j=0; j<osd_order;j++) {

            if(j<=i) continue;

            x[w1_osd_cols[i]]=1;
            x[w1_osd_cols[j]]=1;

            mod2sparse_mulvec(Ht,x,Htx);
            bin_char_add(synd,Htx,g,M);
            LU_forward_backward_solve(L, U, rows, cols, g, y);

            for(int col_no=0;col_no<k;col_no++){
                y[Ht_cols[col_no]]=x[col_no];
            }


            solution_weight=bin_char_weight(y,N);

            if(solution_weight<osd_min_weight){
                osd_min_weight=solution_weight;
                for(int bit_no=0;bit_no<N;bit_no++) osdw_decoding[bit_no]=y[bit_no];
            }

            x[w1_osd_cols[i]]=0;
            x[w1_osd_cols[j]]=0;

        }

    }





    free(w1_osd_weights);
    free(w1_osd_cols);
    free(Htx);
    free(Ht_cols);
    free(x);
    free(y);
    free(g);
    mod2sparse_free(Ht);
    free(rows);
    free(cols);
    mod2sparse_free(L);
    mod2sparse_free(U);

    return 0;

}